

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

uint __thiscall Assimp::XGLImporter::ResolveMaterialRef(XGLImporter *this,TempScope *scope)

{
  aiMaterial *paVar1;
  bool bVar2;
  reference ppVar3;
  size_type sVar4;
  reference ppaVar5;
  uint local_ac;
  uint mcount;
  uint i;
  aiMaterial *m;
  string local_98;
  _Self local_78;
  iterator end;
  _Self local_68;
  iterator it;
  int id;
  string local_48;
  string *local_28;
  string *s;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  s = (string *)scope;
  scope_local = (TempScope *)this;
  GetElementName_abi_cxx11_(&local_48,this);
  local_28 = &local_48;
  bVar2 = std::operator==(&local_48,"mat");
  if (bVar2) {
    ReadMaterial(this,(TempScope *)s);
    sVar4 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                       ((long)&s[3].field_2 + 8));
    this_local._4_4_ = (int)sVar4 - 1;
  }
  else {
    end._M_node._4_4_ = ReadIndexFromText(this);
    it._M_node._4_4_ = end._M_node._4_4_;
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
         ::find((map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
                 *)&s[1].field_2,(key_type *)((long)&end._M_node + 4));
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
         ::end((map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
                *)&s[1].field_2);
    bVar2 = std::operator==(&local_68,&local_78);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"<matref> index out of range",(allocator<char> *)((long)&m + 7)
                );
      LogFunctions<Assimp::XGLImporter>::ThrowException(&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&m + 7));
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_aiMaterial_*>_>::operator*
                       (&local_68);
    paVar1 = ppVar3->second;
    local_ac = 0;
    sVar4 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                       ((long)&s[3].field_2 + 8));
    while( true ) {
      if ((uint)sVar4 <= local_ac) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/XGL/XGLLoader.cpp"
                      ,0x2d9,"unsigned int Assimp::XGLImporter::ResolveMaterialRef(TempScope &)");
      }
      ppaVar5 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                           ((long)&s[3].field_2 + 8),(ulong)local_ac);
      if (*ppaVar5 == paVar1) break;
      local_ac = local_ac + 1;
    }
    this_local._4_4_ = local_ac;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return this_local._4_4_;
}

Assistant:

unsigned int XGLImporter::ResolveMaterialRef(TempScope& scope)
{
    const std::string& s = GetElementName();
    if (s == "mat") {
        ReadMaterial(scope);
        return static_cast<unsigned int>(scope.materials_linear.size()-1);
    }

    const int id = ReadIndexFromText();

    std::map<unsigned int, aiMaterial*>::iterator it = scope.materials.find(id), end = scope.materials.end();
    if (it == end) {
        ThrowException("<matref> index out of range");
    }

    // ok, this is n^2 and should get optimized one day
    aiMaterial* const m = (*it).second;

    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.materials_linear.size());
    for(; i < mcount; ++i) {
        if (scope.materials_linear[i] == m) {
            return i;
        }
    }

    ai_assert(false);
    return 0;
}